

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O0

int Abc_NtkSopToAig(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Hop_Man_t *p;
  Abc_Obj_t *pObj;
  Hop_Obj_t *pHVar2;
  int local_2c;
  int Max;
  int i;
  Hop_Man_t *pMan;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkHasSop(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkHasSop(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                  ,0x32f,"int Abc_NtkSopToAig(Abc_Ntk_t *)");
  }
  p = Hop_ManStart();
  iVar1 = Abc_NtkGetFaninMax(pNtk);
  if (iVar1 != 0) {
    Hop_IthVar(p,iVar1 + -1);
  }
  local_2c = 0;
  do {
    iVar1 = Vec_PtrSize(pNtk->vObjs);
    if (iVar1 <= local_2c) {
      Mem_FlexStop((Mem_Flex_t *)pNtk->pManFunc,0);
      pNtk->pManFunc = p;
      pNtk->ntkFunc = ABC_FUNC_AIG;
      return 1;
    }
    pObj = Abc_NtkObj(pNtk,local_2c);
    if (((pObj != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pObj), iVar1 != 0)) &&
       (iVar1 = Abc_ObjIsBarBuf(pObj), iVar1 == 0)) {
      if ((pObj->field_5).pData == (void *)0x0) {
        __assert_fail("pNode->pData",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                      ,0x33e,"int Abc_NtkSopToAig(Abc_Ntk_t *)");
      }
      pHVar2 = Abc_ConvertSopToAig(p,(char *)(pObj->field_5).pData);
      (pObj->field_5).pData = pHVar2;
      if ((pObj->field_5).pData == (void *)0x0) {
        Hop_ManStop(p);
        printf("Abc_NtkSopToAig: Error while converting SOP into AIG.\n");
        return 0;
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

int Abc_NtkSopToAig( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    Hop_Man_t * pMan;
    int i, Max;

    assert( Abc_NtkHasSop(pNtk) ); 

    // make dist1-free and SCC-free
//    Abc_NtkMakeLegit( pNtk );

    // start the functionality manager
    pMan = Hop_ManStart();
    Max = Abc_NtkGetFaninMax(pNtk);
    if ( Max ) Hop_IthVar( pMan, Max-1 );

    // convert each node from SOP to BDD
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_ObjIsBarBuf(pNode) )
            continue;
        assert( pNode->pData );
        pNode->pData = Abc_ConvertSopToAig( pMan, (char *)pNode->pData );
        if ( pNode->pData == NULL )
        {
            Hop_ManStop( pMan );
            printf( "Abc_NtkSopToAig: Error while converting SOP into AIG.\n" );
            return 0;
        }
    }
    Mem_FlexStop( (Mem_Flex_t *)pNtk->pManFunc, 0 );
    pNtk->pManFunc = pMan;

    // update the network type
    pNtk->ntkFunc = ABC_FUNC_AIG;
    return 1;
}